

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void * libdeflate_aligned_malloc(malloc_func_t malloc_func,size_t alignment,size_t size)

{
  void *orig_ptr;
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = (*malloc_func)(alignment + size + 7);
  if (pvVar1 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)(-alignment & (long)pvVar1 + alignment + 7);
    *(void **)((long)pvVar2 + -8) = pvVar1;
  }
  return pvVar2;
}

Assistant:

void *
libdeflate_aligned_malloc(malloc_func_t malloc_func,
			  size_t alignment, size_t size)
{
	void *ptr = (*malloc_func)(sizeof(void *) + alignment - 1 + size);

	if (ptr) {
		void *orig_ptr = ptr;

		ptr = (void *)ALIGN((uintptr_t)ptr + sizeof(void *), alignment);
		((void **)ptr)[-1] = orig_ptr;
	}
	return ptr;
}